

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O3

void recff_buffer_method_put(jit_State *J,RecordFFData *rd)

{
  TRef TVar1;
  TRef TVar2;
  TRef TVar3;
  uint uVar4;
  TRef *pTVar5;
  long lVar6;
  IRRef1 IVar7;
  
  TVar1 = recff_sbufx_check(J,(RecordFFData *)&rd->argv->gcr,0);
  TVar2 = recff_sbufx_write(J,TVar1);
  pTVar5 = J->base;
  uVar4 = pTVar5[1];
  if (uVar4 == 0) {
    return;
  }
  lVar6 = 1;
  do {
    if ((uVar4 & 0x1f000000) == 0xc000000) {
      TVar3 = recff_sbufx_check(J,(RecordFFData *)&rd->argv->gcr,lVar6);
      (J->fold).ins.field_0.ot = 0x989;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
      lj_opt_fold(J);
      pTVar5 = J->base;
    }
    uVar4 = pTVar5[lVar6 + 1];
    lVar6 = lVar6 + 1;
  } while (uVar4 != 0);
  TVar1 = pTVar5[1];
  if (TVar1 != 0) {
    lVar6 = 8;
    do {
      uVar4 = TVar1 & 0x1f000000;
      IVar7 = (IRRef1)TVar1;
      if (uVar4 == 0x4000000) {
        (J->fold).ins.field_0.ot = 0x5689;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
        (J->fold).ins.field_0.op2 = IVar7;
LAB_0015638e:
        TVar2 = lj_opt_fold(J);
      }
      else {
        if ((TVar1 >> 0x18 & 0x1e) - 0xe < 6) {
          (J->fold).ins.field_0.ot = 0x5d04;
          (J->fold).ins.field_0.op1 = IVar7;
          *(ushort *)((long)&(J->fold).ins + 2) = (ushort)(uVar4 == 0xe000000);
          TVar1 = lj_opt_fold(J);
          (J->fold).ins.field_0.ot = 0x5689;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar1;
          goto LAB_0015638e;
        }
        if (uVar4 == 0xc000000) {
          (J->fold).ins.field_0.op1 = IVar7;
          *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45090013;
          TVar1 = lj_opt_fold(J);
          (J->fold).ins.field_0.op1 = IVar7;
          *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x4509000e;
          TVar3 = lj_opt_fold(J);
          (J->fold).ins.field_0.ot = 0x2a15;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar1;
          TVar3 = lj_opt_fold(J);
          (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
          *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b131275;
          TVar3 = lj_opt_fold(J);
          TVar2 = lj_ir_call(J,IRCALL_lj_buf_putmem,(ulong)TVar2,(ulong)TVar1,(ulong)TVar3);
        }
        else {
          recff_nyi(J,rd);
        }
      }
      TVar1 = *(uint *)((long)J->base + lVar6);
      lVar6 = lVar6 + 4;
    } while (TVar1 != 0);
  }
  (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
  *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x12000000;
  lj_opt_fold(J);
  return;
}

Assistant:

static void LJ_FASTCALL recff_buffer_method_put(jit_State *J, RecordFFData *rd)
{
  TRef ud = recff_sbufx_check(J, rd, 0);
  TRef trbuf = recff_sbufx_write(J, ud);
  TRef tr;
  ptrdiff_t arg;
  if (!J->base[1]) return;
  for (arg = 1; (tr = J->base[arg]); arg++) {
    if (tref_isudata(tr)) {
      TRef ud2 = recff_sbufx_check(J, rd, arg);
      emitir(IRTG(IR_NE, IRT_PGC), ud, ud2);
    }
  }
  for (arg = 1; (tr = J->base[arg]); arg++) {
    if (tref_isstr(tr)) {
      trbuf = emitir(IRTG(IR_BUFPUT, IRT_PGC), trbuf, tr);
    } else if (tref_isnumber(tr)) {
      trbuf = emitir(IRTG(IR_BUFPUT, IRT_PGC), trbuf,
		     emitir(IRT(IR_TOSTR, IRT_STR), tr,
			    tref_isnum(tr) ? IRTOSTR_NUM : IRTOSTR_INT));
    } else if (tref_isudata(tr)) {
      TRef trr = recff_sbufx_get_ptr(J, tr, IRFL_SBUF_R);
      TRef trw = recff_sbufx_get_ptr(J, tr, IRFL_SBUF_W);
      TRef len = recff_sbufx_len(J, trr, trw);
      trbuf = lj_ir_call(J, IRCALL_lj_buf_putmem, trbuf, trr, len);
    } else {
      recff_nyiu(J, rd);
    }
  }
  emitir(IRT(IR_USE, IRT_NIL), trbuf, 0);
}